

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O3

void __thiscall glTF2::Material::Material(Material *this)

{
  (this->super_Object).id._M_dataplus._M_p = (pointer)&(this->super_Object).id.field_2;
  (this->super_Object).id._M_string_length = 0;
  (this->super_Object).id.field_2._M_local_buf[0] = '\0';
  (this->super_Object).name._M_dataplus._M_p = (pointer)&(this->super_Object).name.field_2;
  (this->super_Object).name._M_string_length = 0;
  (this->super_Object).name.field_2._M_local_buf[0] = '\0';
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_007db770;
  (this->pbrMetallicRoughness).baseColorTexture.texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->pbrMetallicRoughness).baseColorTexture.texture.index = 0;
  (this->pbrMetallicRoughness).metallicRoughnessTexture.texCoord = 0;
  *(undefined8 *)&(this->pbrMetallicRoughness).baseColorTexture.texCoord = 0;
  *(undefined8 *)((long)&(this->pbrMetallicRoughness).metallicRoughnessTexture.texture.vector + 4) =
       0;
  (this->normalTexture).super_TextureInfo.texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->normalTexture).super_TextureInfo.texture.index = 0;
  *(undefined8 *)&(this->normalTexture).super_TextureInfo.texCoord = 0x3f80000000000000;
  (this->occlusionTexture).super_TextureInfo.texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->occlusionTexture).super_TextureInfo.texture.index = 0;
  *(undefined8 *)&(this->occlusionTexture).super_TextureInfo.texCoord = 0x3f80000000000000;
  (this->emissiveTexture).texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->emissiveTexture).texture.index = 0;
  (this->emissiveTexture).texCoord = 0;
  (this->alphaMode)._M_dataplus._M_p = (pointer)&(this->alphaMode).field_2;
  (this->alphaMode)._M_string_length = 0;
  (this->alphaMode).field_2._M_local_buf[0] = '\0';
  (this->pbrSpecularGlossiness).value.diffuseTexture.texture.vector =
       (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0;
  (this->pbrSpecularGlossiness).value.diffuseTexture.texture.index = 0;
  (this->pbrSpecularGlossiness).value.specularGlossinessTexture.texCoord = 0;
  *(undefined8 *)&(this->pbrSpecularGlossiness).value.diffuseTexture.texCoord = 0;
  *(undefined8 *)
   ((long)&(this->pbrSpecularGlossiness).value.specularGlossinessTexture.texture.vector + 4) = 0;
  (this->pbrSpecularGlossiness).value.diffuseFactor[0] = 1.0;
  (this->pbrSpecularGlossiness).value.diffuseFactor[1] = 1.0;
  (this->pbrSpecularGlossiness).value.diffuseFactor[2] = 1.0;
  (this->pbrSpecularGlossiness).value.diffuseFactor[3] = 1.0;
  (this->pbrSpecularGlossiness).value.specularFactor[0] = 1.0;
  (this->pbrSpecularGlossiness).value.specularFactor[1] = 1.0;
  *(undefined8 *)((this->pbrSpecularGlossiness).value.specularFactor + 2) = 0x3f8000003f800000;
  (this->pbrSpecularGlossiness).isPresent = false;
  (this->pbrMetallicRoughness).baseColorFactor[0] = 1.0;
  (this->pbrMetallicRoughness).baseColorFactor[1] = 1.0;
  (this->pbrMetallicRoughness).baseColorFactor[2] = 1.0;
  (this->pbrMetallicRoughness).baseColorFactor[3] = 1.0;
  (this->pbrMetallicRoughness).metallicFactor = 1.0;
  (this->pbrMetallicRoughness).roughnessFactor = 1.0;
  this->emissiveFactor[0] = 0.0;
  this->emissiveFactor[1] = 0.0;
  this->emissiveFactor[2] = 0.0;
  std::__cxx11::string::_M_replace((ulong)&this->alphaMode,0,(char *)0x0,0x68a573);
  this->alphaCutoff = 0.5;
  this->doubleSided = false;
  this->unlit = false;
  return;
}

Assistant:

Material() { SetDefaults(); }